

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O1

cx_string<18UL> * __thiscall
mserialize::cx_strcat<4ul,3ul,1ul,3ul,2ul,3ul,1ul,1ul>
          (cx_string<18UL> *__return_storage_ptr__,mserialize *this,cx_string<4UL> *strings,
          cx_string<3UL> *strings_1,cx_string<1UL> *strings_2,cx_string<3UL> *strings_3,
          cx_string<2UL> *strings_4,cx_string<3UL> *strings_5,cx_string<1UL> *strings_6,
          cx_string<1UL> *strings_7)

{
  long lVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 local_b8;
  undefined7 uStack_b0;
  undefined1 uStack_a9;
  undefined2 uStack_a8;
  ulong local_98 [3];
  char buffer [19];
  size_t size [9];
  
  puVar3 = &local_b8;
  local_b8 = 0;
  uStack_b0 = 0;
  uStack_a9 = 0;
  uStack_a8 = 0;
  size[4] = (size_t)this;
  size[5] = (size_t)strings;
  size[6] = (size_t)strings_1;
  size[7] = (size_t)strings_2;
  size[8] = (size_t)strings_3;
  local_98[1] = 4;
  local_98[2] = 3;
  lVar1 = 1;
  buffer[0] = '\x01';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\x03';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  stack0xffffffffffffff90 = 2;
  size[0] = 1;
  size[1] = 1;
  do {
    if (local_98[lVar1] != 0) {
      uVar2 = 0;
      do {
        *(undefined1 *)((long)puVar3 + uVar2) = *(undefined1 *)(size[lVar1 + 3] + uVar2);
        uVar2 = uVar2 + 1;
      } while (uVar2 < local_98[lVar1]);
      puVar3 = (undefined8 *)((long)puVar3 + uVar2);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 9);
  __return_storage_ptr__->_data[0x12] = '\0';
  *(undefined8 *)__return_storage_ptr__->_data = local_b8;
  *(ulong *)(__return_storage_ptr__->_data + 8) = CONCAT17(uStack_a9,uStack_b0);
  *(undefined2 *)(__return_storage_ptr__->_data + 0x10) = uStack_a8;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}